

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:613:13)>
::getImpl(SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:613:13)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<unsigned_long>_> *pEVar1;
  OwnFd *in;
  Promise<unsigned_long> local_540;
  ExceptionOr<kj::Promise<unsigned_long>_> local_538;
  OwnFd *local_390;
  OwnFd *depValue;
  OwnFd *_depValue779;
  Exception *local_1d8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1b8 [8];
  ExceptionOr<kj::OwnFd> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:613:13)>
  *this_local;
  
  depResult.value.ptr = (NullableValue<kj::OwnFd>)output;
  ExceptionOr<kj::OwnFd>::ExceptionOr((ExceptionOr<kj::OwnFd> *)local_1b8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1b8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::OwnFd>
                         ((Maybe<kj::OwnFd> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (OwnFd *)0x0) {
      local_390 = depValue;
      in = mv<kj::OwnFd>(depValue);
      MaybeVoidCaller<kj::OwnFd,kj::Promise<unsigned_long>>::
      apply<kj::(anonymous_namespace)::TestCase581::run()::__4>
                ((MaybeVoidCaller<kj::OwnFd,kj::Promise<unsigned_long>> *)&local_540,&this->func,in)
      ;
      TransformPromiseNodeBase::handle<kj::Promise<unsigned_long>>
                (&local_538,&this->super_TransformPromiseNodeBase,&local_540);
      pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>
                         ((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<kj::Promise<unsigned_long>_>::operator=(pEVar1,&local_538);
      ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_538);
      Promise<unsigned_long>::~Promise(&local_540);
    }
  }
  else {
    local_1d8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<unsigned_long>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>
                       ((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779);
  }
  ExceptionOr<kj::OwnFd>::~ExceptionOr((ExceptionOr<kj::OwnFd> *)local_1b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }